

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_>::~basic_bson_cursor
          (basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor = pp_Var1;
  *(void **)(pp_Var1[-3] + (long)&(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor) =
       vtt[1];
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::~basic_bson_parser
            (&this->parser_);
  return;
}

Assistant:

~basic_bson_cursor() = default;